

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_tweak_add(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak)

{
  int iVar1;
  bool bVar2;
  secp256k1_ge p;
  secp256k1_ge_storage s;
  secp256k1_ge sStack_b8;
  secp256k1_ge_storage local_60;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ec_pubkey_tweak_add_cold_3();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ec_pubkey_tweak_add_cold_2();
  }
  else {
    if (tweak != (uchar *)0x0) {
      iVar1 = secp256k1_pubkey_load(ctx,&sStack_b8,pubkey);
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      if (iVar1 == 0) {
        bVar2 = false;
      }
      else {
        iVar1 = secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx,&sStack_b8,tweak);
        bVar2 = iVar1 != 0;
      }
      if (bVar2 != false) {
        secp256k1_ge_to_storage(&local_60,&sStack_b8);
        *(uint64_t *)(pubkey->data + 0x30) = local_60.y.n[2];
        *(uint64_t *)(pubkey->data + 0x38) = local_60.y.n[3];
        *(uint64_t *)(pubkey->data + 0x20) = local_60.y.n[0];
        *(uint64_t *)(pubkey->data + 0x28) = local_60.y.n[1];
        *(uint64_t *)(pubkey->data + 0x10) = local_60.x.n[2];
        *(uint64_t *)(pubkey->data + 0x18) = local_60.x.n[3];
        *(uint64_t *)pubkey->data = local_60.x.n[0];
        *(uint64_t *)(pubkey->data + 8) = local_60.x.n[1];
      }
      goto LAB_001197df;
    }
    secp256k1_ec_pubkey_tweak_add_cold_1();
  }
  bVar2 = false;
LAB_001197df:
  return (uint)bVar2;
}

Assistant:

int secp256k1_ec_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak) {
    secp256k1_ge p;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    ret = ret && secp256k1_ec_pubkey_tweak_add_helper(&ctx->ecmult_ctx, &p, tweak);
    if (ret) {
        secp256k1_pubkey_save(pubkey, &p);
    }

    return ret;
}